

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenTableGetSetTable(BinaryenExpressionRef expr,char *table)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id != TableGetId) {
    __assert_fail("expression->is<TableGet>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x9cf,"void BinaryenTableGetSetTable(BinaryenExpressionRef, const char *)");
  }
  if (table != (char *)0x0) {
    this = (IString *)strlen(table);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)table;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 1) = sVar1;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x9d0,"void BinaryenTableGetSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenTableGetSetTable(BinaryenExpressionRef expr, const char* table) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGet>());
  assert(table);
  static_cast<TableGet*>(expression)->table = table;
}